

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

previous_contract *
cppwinrt::decode_previous_contract_attribute
          (previous_contract *__return_storage_ptr__,CustomAttribute *attribute)

{
  uint uVar1;
  vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_> *this;
  size_type sVar2;
  const_reference pvVar3;
  cppwinrt *pcVar4;
  FixedArgSig *pFVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_> *args;
  CustomAttributeSig signature;
  CustomAttribute *attribute_local;
  
  signature.m_named_args.
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)attribute;
  winmd::reader::CustomAttribute::Value((CustomAttributeSig *)&args,attribute);
  this = winmd::reader::CustomAttributeSig::FixedArgs((CustomAttributeSig *)&args);
  sVar2 = std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::size
                    (this);
  if (2 < sVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&__return_storage_ptr__->contract_from);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&__return_storage_ptr__->contract_to);
    __return_storage_ptr__->version_low = 0;
    __return_storage_ptr__->version_high = 0;
    pvVar3 = std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
             operator[](this,0);
    bVar6 = get_attribute_value<std::basic_string_view<char,std::char_traits<char>>>(pvVar3);
    (__return_storage_ptr__->contract_from)._M_len = bVar6._M_len;
    (__return_storage_ptr__->contract_from)._M_str = bVar6._M_str;
    pFVar5 = (FixedArgSig *)0x1;
    pcVar4 = (cppwinrt *)
             std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
             operator[](this,1);
    uVar1 = get_integer_attribute<unsigned_int>(pcVar4,pFVar5);
    __return_storage_ptr__->version_low = uVar1;
    pFVar5 = (FixedArgSig *)0x2;
    pcVar4 = (cppwinrt *)
             std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
             operator[](this,2);
    uVar1 = get_integer_attribute<unsigned_int>(pcVar4,pFVar5);
    __return_storage_ptr__->version_high = uVar1;
    sVar2 = std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
            size(this);
    if (sVar2 == 4) {
      pvVar3 = std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
               ::operator[](this,3);
      bVar6 = get_attribute_value<std::basic_string_view<char,std::char_traits<char>>>(pvVar3);
      (__return_storage_ptr__->contract_to)._M_len = bVar6._M_len;
      (__return_storage_ptr__->contract_to)._M_str = bVar6._M_str;
    }
    winmd::reader::CustomAttributeSig::~CustomAttributeSig((CustomAttributeSig *)&args);
    return __return_storage_ptr__;
  }
  __assert_fail("args.size() >= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/helpers.h"
                ,0x183,
                "previous_contract cppwinrt::decode_previous_contract_attribute(const CustomAttribute &)"
               );
}

Assistant:

static previous_contract decode_previous_contract_attribute(CustomAttribute const& attribute)
    {
        // PreviousContractVersionAttribute has two constructors:
        //      .ctor(string fromContract, uint32 versionLow, uint32 versionHigh)
        //      .ctor(string fromContract, uint32 versionLow, uint32 versionHigh, string contractTo)
        auto signature = attribute.Value();
        auto& args = signature.FixedArgs();
        assert(args.size() >= 3);

        previous_contract result{};
        result.contract_from = get_attribute_value<std::string_view>(args[0]);
        result.version_low = get_integer_attribute<uint32_t>(args[1]);
        result.version_high = get_integer_attribute<uint32_t>(args[2]);
        if (args.size() == 4)
        {
            result.contract_to = get_attribute_value<std::string_view>(args[3]);
        }

        return result;
    }